

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomTargetCommand.cxx
# Opt level: O0

bool __thiscall
cmAddCustomTargetCommand::InitialPass
          (cmAddCustomTargetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  const_reference input;
  long lVar4;
  ostream *poVar5;
  size_type sVar6;
  const_reference pvVar7;
  char *pcVar8;
  ulong uVar9;
  cmTarget *this_00;
  PolicyID id;
  byte local_7fa;
  cmTarget *target;
  undefined1 local_768 [6];
  bool escapeOldStyle;
  allocator local_741;
  string local_740;
  allocator local_719;
  string local_718;
  string local_6f8;
  char *local_6d8;
  char *build_dir;
  string msg_1;
  string local_690;
  byte local_669;
  undefined1 local_668 [7];
  bool issueMessage;
  ostringstream e_1;
  MessageType local_4f0;
  bool local_4e9;
  MessageType messageType;
  bool nameOk;
  undefined1 local_4c8 [8];
  ostringstream msg;
  size_type pos;
  string local_340;
  undefined1 local_320 [8];
  string dep;
  string filename;
  string *copy;
  uint j;
  uint start;
  undefined1 local_2c8 [3];
  bool excludeFromAll;
  tdoing doing;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  char *comment;
  string comment_buffer;
  undefined1 local_280 [5];
  bool command_expand_lists;
  bool uses_terminal;
  bool verbatim;
  string working_directory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines commandLines;
  cmCustomCommandLine currentLine;
  ostringstream local_1e0 [8];
  ostringstream e;
  string *targetName;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_3_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmAddCustomTargetCommand *this_local;
  
  local_28 = param_2;
  param_3_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_006383f4;
  }
  input = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_3_local,0);
  lVar4 = std::__cxx11::string::find_first_of((char *)input,0xa17542);
  if (lVar4 != -1) {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    poVar5 = std::operator<<((ostream *)local_1e0,"called with invalid target name \"");
    poVar5 = std::operator<<(poVar5,(string *)input);
    poVar5 = std::operator<<(poVar5,"\".  Target names may not contain a slash.  ");
    std::operator<<(poVar5,"Use ADD_CUSTOM_COMMAND to generate files.");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,
                        (string *)
                        &currentLine.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &currentLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
    goto LAB_006383f4;
  }
  cmCustomCommandLine::cmCustomCommandLine
            ((cmCustomCommandLine *)
             &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cmCustomCommandLines::cmCustomCommandLines
            ((cmCustomCommandLines *)
             &depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&byproducts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&working_directory.field_2 + 8));
  std::__cxx11::string::string((string *)local_280);
  comment_buffer.field_2._M_local_buf[0xf] = '\0';
  comment_buffer.field_2._M_local_buf[0xe] = '\0';
  comment_buffer.field_2._M_local_buf[0xd] = '\0';
  std::__cxx11::string::string((string *)&comment);
  sources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_2c8);
  start = 0;
  j._3_1_ = true;
  copy._4_4_ = 1;
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_3_local);
  if (1 < sVar6) {
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_3_local,1);
    bVar2 = std::operator==(pvVar7,"ALL");
    if (bVar2) {
      copy._4_4_ = 2;
    }
    j._3_1_ = !bVar2;
  }
  for (copy._0_4_ = copy._4_4_;
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_3_local), (uint)copy < sVar6; copy._0_4_ = (uint)copy + 1) {
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_3_local,(ulong)(uint)copy);
    bVar2 = std::operator==(pvVar7,"DEPENDS");
    if (bVar2) {
      start = 1;
    }
    else {
      bVar2 = std::operator==(pvVar7,"BYPRODUCTS");
      if (bVar2) {
        start = 2;
      }
      else {
        bVar2 = std::operator==(pvVar7,"WORKING_DIRECTORY");
        if (bVar2) {
          start = 3;
        }
        else {
          bVar2 = std::operator==(pvVar7,"VERBATIM");
          if (bVar2) {
            start = 6;
            comment_buffer.field_2._M_local_buf[0xf] = '\x01';
          }
          else {
            bVar2 = std::operator==(pvVar7,"USES_TERMINAL");
            if (bVar2) {
              start = 6;
              comment_buffer.field_2._M_local_buf[0xe] = '\x01';
            }
            else {
              bVar2 = std::operator==(pvVar7,"COMMAND_EXPAND_LISTS");
              if (bVar2) {
                start = 6;
                comment_buffer.field_2._M_local_buf[0xd] = '\x01';
              }
              else {
                bVar2 = std::operator==(pvVar7,"COMMENT");
                if (bVar2) {
                  start = 4;
                }
                else {
                  bVar2 = std::operator==(pvVar7,"COMMAND");
                  if (bVar2) {
                    start = 0;
                    bVar2 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&commandLines.
                                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                        .
                                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    if (!bVar2) {
                      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
                      push_back((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *
                                )&depends.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (value_type *)
                                &commandLines.
                                 super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                 .
                                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&commandLines.
                                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                  .
                                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    }
                  }
                  else {
                    bVar2 = std::operator==(pvVar7,"SOURCES");
                    if (bVar2) {
                      start = 5;
                    }
                    else {
                      switch(start) {
                      case 0:
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&commandLines.
                                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                        .
                                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar7);
                        break;
                      case 1:
                        std::__cxx11::string::string((string *)local_320,(string *)pvVar7);
                        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_320);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&byproducts.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (value_type *)local_320);
                        std::__cxx11::string::~string((string *)local_320);
                        break;
                      case 2:
                        std::__cxx11::string::string((string *)(dep.field_2._M_local_buf + 8));
                        pcVar8 = (char *)std::__cxx11::string::c_str();
                        bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar8);
                        if (!bVar2) {
                          pcVar8 = cmMakefile::GetCurrentBinaryDirectory
                                             ((this->super_cmCommand).Makefile);
                          std::__cxx11::string::operator=
                                    ((string *)(dep.field_2._M_local_buf + 8),pcVar8);
                          std::__cxx11::string::operator+=
                                    ((string *)(dep.field_2._M_local_buf + 8),"/");
                        }
                        std::__cxx11::string::operator+=
                                  ((string *)(dep.field_2._M_local_buf + 8),(string *)pvVar7);
                        cmsys::SystemTools::ConvertToUnixSlashes((string *)((long)&dep.field_2 + 8))
                        ;
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)((long)&working_directory.field_2 + 8),
                                    (value_type *)((long)&dep.field_2 + 8));
                        std::__cxx11::string::~string((string *)(dep.field_2._M_local_buf + 8));
                        break;
                      case 3:
                        std::__cxx11::string::operator=((string *)local_280,(string *)pvVar7);
                        break;
                      case 4:
                        std::__cxx11::string::operator=((string *)&comment,(string *)pvVar7);
                        sources.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage =
                             (pointer)std::__cxx11::string::c_str();
                        break;
                      case 5:
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_2c8,pvVar7);
                        break;
                      default:
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)&local_340,"Wrong syntax. Unknown type of argument.",
                                   (allocator *)((long)&pos + 7));
                        cmCommand::SetError(&this->super_cmCommand,&local_340);
                        std::__cxx11::string::~string((string *)&local_340);
                        std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
                        this_local._7_1_ = 0;
                        pos._0_4_ = 1;
                        goto LAB_00638348;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  lVar4 = std::__cxx11::string::find_first_of((char *)input,0xa12ee9);
  if (lVar4 == -1) {
    bVar2 = cmGeneratorExpression::IsValidTargetName(input);
    local_7fa = 0;
    if (bVar2) {
      bVar2 = cmGlobalGenerator::IsReservedTarget(input);
      local_7fa = bVar2 ^ 0xff;
    }
    local_4e9 = (bool)(local_7fa & 1);
    if (local_4e9 != false) {
      lVar4 = std::__cxx11::string::find((char)input,0x3a);
      local_4e9 = lVar4 == -1;
    }
    if (local_4e9 == false) {
      local_4f0 = AUTHOR_WARNING;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_668);
      local_669 = 0;
      PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0037);
      if (PVar3 != OLD) {
        if (PVar3 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_690,(cmPolicies *)0x25,id);
          poVar5 = std::operator<<((ostream *)local_668,(string *)&local_690);
          std::operator<<(poVar5,"\n");
          std::__cxx11::string::~string((string *)&local_690);
          local_669 = 1;
        }
        else if (PVar3 - NEW < 3) {
          local_669 = 1;
          local_4f0 = FATAL_ERROR;
        }
      }
      if ((local_669 & 1) == 0) {
LAB_00637e23:
        pos._0_4_ = 0;
      }
      else {
        poVar5 = std::operator<<((ostream *)local_668,"The target name \"");
        poVar5 = std::operator<<(poVar5,(string *)input);
        std::operator<<(poVar5,
                        "\" is reserved or not valid for certain CMake features, such as generator expressions, and may result in undefined behavior."
                       );
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar1,local_4f0,(string *)((long)&msg_1.field_2 + 8));
        std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
        if (local_4f0 != FATAL_ERROR) goto LAB_00637e23;
        this_local._7_1_ = 0;
        pos._0_4_ = 1;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_668);
      if ((uint)pos != 0) goto LAB_00638348;
    }
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&commandLines.
                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar2) {
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                 &depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (value_type *)
                 &commandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&commandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::__cxx11::string::string((string *)&build_dir);
    bVar2 = cmMakefile::EnforceUniqueName
                      ((this->super_cmCommand).Makefile,input,(string *)&build_dir,true);
    if (!bVar2) {
      cmCommand::SetError(&this->super_cmCommand,(string *)&build_dir);
      this_local._7_1_ = 0;
    }
    pos._0_4_ = (uint)!bVar2;
    std::__cxx11::string::~string((string *)&build_dir);
    if ((uint)pos == 0) {
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        local_6d8 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
        cmsys::SystemTools::CollapseFullPath(&local_6f8,(string *)local_280,local_6d8);
        std::__cxx11::string::operator=((string *)local_280,(string *)&local_6f8);
        std::__cxx11::string::~string((string *)&local_6f8);
      }
      bVar2 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::empty
                        ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                         &depends.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((!bVar2) ||
         (bVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&working_directory.field_2 + 8)), bVar2)) {
        bVar2 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::empty
                          ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                           &depends.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((bVar2) && ((comment_buffer.field_2._M_local_buf[0xe] & 1U) != 0)) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_740,"USES_TERMINAL may not be specified without any COMMAND",
                     &local_741);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_740);
          std::__cxx11::string::~string((string *)&local_740);
          std::allocator<char>::~allocator((allocator<char> *)&local_741);
          this_local._7_1_ = 1;
          pos._0_4_ = 1;
        }
        else {
          bVar2 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::empty
                            ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                             &depends.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if ((bVar2) && ((comment_buffer.field_2._M_local_buf[0xd] & 1U) != 0)) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)local_768,
                       "COMMAND_EXPAND_LISTS may not be specified without any COMMAND",
                       (allocator *)((long)&target + 7));
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_768);
            std::__cxx11::string::~string((string *)local_768);
            std::allocator<char>::~allocator((allocator<char> *)((long)&target + 7));
            this_local._7_1_ = 1;
            pos._0_4_ = 1;
          }
          else {
            target._6_1_ = ~comment_buffer.field_2._M_local_buf[0xf] & 1;
            pcVar1 = (this->super_cmCommand).Makefile;
            pcVar8 = (char *)std::__cxx11::string::c_str();
            this_00 = cmMakefile::AddUtilityCommand
                                (pcVar1,input,j._3_1_,pcVar8,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)((long)&working_directory.field_2 + 8),
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&byproducts.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (cmCustomCommandLines *)
                                 &depends.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (bool)(target._6_1_ & 1),
                                 (char *)sources.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (bool)(comment_buffer.field_2._M_local_buf[0xe] & 1),
                                 (bool)(comment_buffer.field_2._M_local_buf[0xd] & 1));
            cmTarget::AddSources
                      (this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_2c8);
            this_local._7_1_ = 1;
            pos._0_4_ = 1;
          }
        }
      }
      else {
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_718,"BYPRODUCTS may not be specified without any COMMAND",
                   &local_719);
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_718);
        std::__cxx11::string::~string((string *)&local_718);
        std::allocator<char>::~allocator((allocator<char> *)&local_719);
        this_local._7_1_ = 1;
        pos._0_4_ = 1;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
    poVar5 = std::operator<<((ostream *)local_4c8,"called with target name containing a \"");
    pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)input);
    poVar5 = std::operator<<(poVar5,*pcVar8);
    std::operator<<(poVar5,"\".  This character is not allowed.");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)&messageType);
    std::__cxx11::string::~string((string *)&messageType);
    this_local._7_1_ = 0;
    pos._0_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
  }
LAB_00638348:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2c8);
  std::__cxx11::string::~string((string *)&comment);
  std::__cxx11::string::~string((string *)local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&working_directory.field_2 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&byproducts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmCustomCommandLines::~cmCustomCommandLines
            ((cmCustomCommandLines *)
             &depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmCustomCommandLine::~cmCustomCommandLine
            ((cmCustomCommandLine *)
             &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
LAB_006383f4:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmAddCustomTargetCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::string const& targetName = args[0];

  // Check the target name.
  if (targetName.find_first_of("/\\") != std::string::npos) {
    std::ostringstream e;
    e << "called with invalid target name \"" << targetName
      << "\".  Target names may not contain a slash.  "
      << "Use ADD_CUSTOM_COMMAND to generate files.";
    this->SetError(e.str());
    return false;
  }

  // Accumulate one command line at a time.
  cmCustomCommandLine currentLine;

  // Save all command lines.
  cmCustomCommandLines commandLines;

  // Accumulate dependencies.
  std::vector<std::string> depends, byproducts;
  std::string working_directory;
  bool verbatim = false;
  bool uses_terminal = false;
  bool command_expand_lists = false;
  std::string comment_buffer;
  const char* comment = CM_NULLPTR;
  std::vector<std::string> sources;

  // Keep track of parser state.
  enum tdoing
  {
    doing_command,
    doing_depends,
    doing_byproducts,
    doing_working_directory,
    doing_comment,
    doing_source,
    doing_nothing
  };
  tdoing doing = doing_command;

  // Look for the ALL option.
  bool excludeFromAll = true;
  unsigned int start = 1;
  if (args.size() > 1) {
    if (args[1] == "ALL") {
      excludeFromAll = false;
      start = 2;
    }
  }

  // Parse the rest of the arguments.
  for (unsigned int j = start; j < args.size(); ++j) {
    std::string const& copy = args[j];

    if (copy == "DEPENDS") {
      doing = doing_depends;
    } else if (copy == "BYPRODUCTS") {
      doing = doing_byproducts;
    } else if (copy == "WORKING_DIRECTORY") {
      doing = doing_working_directory;
    } else if (copy == "VERBATIM") {
      doing = doing_nothing;
      verbatim = true;
    } else if (copy == "USES_TERMINAL") {
      doing = doing_nothing;
      uses_terminal = true;
    } else if (copy == "COMMAND_EXPAND_LISTS") {
      doing = doing_nothing;
      command_expand_lists = true;
    } else if (copy == "COMMENT") {
      doing = doing_comment;
    } else if (copy == "COMMAND") {
      doing = doing_command;

      // Save the current command before starting the next command.
      if (!currentLine.empty()) {
        commandLines.push_back(currentLine);
        currentLine.clear();
      }
    } else if (copy == "SOURCES") {
      doing = doing_source;
    } else {
      switch (doing) {
        case doing_working_directory:
          working_directory = copy;
          break;
        case doing_command:
          currentLine.push_back(copy);
          break;
        case doing_byproducts: {
          std::string filename;
          if (!cmSystemTools::FileIsFullPath(copy.c_str())) {
            filename = this->Makefile->GetCurrentBinaryDirectory();
            filename += "/";
          }
          filename += copy;
          cmSystemTools::ConvertToUnixSlashes(filename);
          byproducts.push_back(filename);
        } break;
        case doing_depends: {
          std::string dep = copy;
          cmSystemTools::ConvertToUnixSlashes(dep);
          depends.push_back(dep);
        } break;
        case doing_comment:
          comment_buffer = copy;
          comment = comment_buffer.c_str();
          break;
        case doing_source:
          sources.push_back(copy);
          break;
        default:
          this->SetError("Wrong syntax. Unknown type of argument.");
          return false;
      }
    }
  }

  std::string::size_type pos = targetName.find_first_of("#<>");
  if (pos != std::string::npos) {
    std::ostringstream msg;
    msg << "called with target name containing a \"" << targetName[pos]
        << "\".  This character is not allowed.";
    this->SetError(msg.str());
    return false;
  }

  // Some requirements on custom target names already exist
  // and have been checked at this point.
  // The following restrictions overlap but depend on policy CMP0037.
  bool nameOk = cmGeneratorExpression::IsValidTargetName(targetName) &&
    !cmGlobalGenerator::IsReservedTarget(targetName);
  if (nameOk) {
    nameOk = targetName.find(':') == std::string::npos;
  }
  if (!nameOk) {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    std::ostringstream e;
    bool issueMessage = false;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0037)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
    }
    if (issueMessage) {
      /* clang-format off */
      e << "The target name \"" << targetName <<
          "\" is reserved or not valid for certain "
          "CMake features, such as generator expressions, and may result "
          "in undefined behavior.";
      /* clang-format on */
      this->Makefile->IssueMessage(messageType, e.str());

      if (messageType == cmake::FATAL_ERROR) {
        return false;
      }
    }
  }

  // Store the last command line finished.
  if (!currentLine.empty()) {
    commandLines.push_back(currentLine);
    currentLine.clear();
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!this->Makefile->EnforceUniqueName(targetName, msg, true)) {
      this->SetError(msg);
      return false;
    }
  }

  // Convert working directory to a full path.
  if (!working_directory.empty()) {
    const char* build_dir = this->Makefile->GetCurrentBinaryDirectory();
    working_directory =
      cmSystemTools::CollapseFullPath(working_directory, build_dir);
  }

  if (commandLines.empty() && !byproducts.empty()) {
    this->Makefile->IssueMessage(
      cmake::FATAL_ERROR,
      "BYPRODUCTS may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && uses_terminal) {
    this->Makefile->IssueMessage(
      cmake::FATAL_ERROR,
      "USES_TERMINAL may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && command_expand_lists) {
    this->Makefile->IssueMessage(
      cmake::FATAL_ERROR,
      "COMMAND_EXPAND_LISTS may not be specified without any COMMAND");
    return true;
  }

  // Add the utility target to the makefile.
  bool escapeOldStyle = !verbatim;
  cmTarget* target = this->Makefile->AddUtilityCommand(
    targetName, excludeFromAll, working_directory.c_str(), byproducts, depends,
    commandLines, escapeOldStyle, comment, uses_terminal,
    command_expand_lists);

  // Add additional user-specified source files to the target.
  target->AddSources(sources);

  return true;
}